

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
::
binary_search_impl<std::pair<int,int>,phmap::priv::upper_bound_adapter<phmap::Less<std::pair<int,int>>>>
          (btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
           *this,pair<int,_int> *k,int s,int e,void *comp)

{
  bool bVar1;
  int iVar2;
  key_type *a;
  int mid;
  upper_bound_adapter<phmap::Less<std::pair<int,_int>_>_> *comp_local;
  int e_local;
  int s_local;
  pair<int,_int> *k_local;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
  *this_local;
  
  iVar2 = e;
  comp_local._4_4_ = s;
  while (comp_local._0_4_ = iVar2, comp_local._4_4_ != (int)comp_local) {
    iVar2 = comp_local._4_4_ + (int)comp_local >> 1;
    a = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
        ::key((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
               *)this,(long)iVar2);
    bVar1 = upper_bound_adapter<phmap::Less<std::pair<int,int>>>::operator()(comp,a,k);
    if (bVar1) {
      comp_local._4_4_ = iVar2 + 1;
      iVar2 = (int)comp_local;
    }
  }
  return (SearchResult<int,_false>)comp_local._4_4_;
}

Assistant:

SearchResult<int, false> binary_search_impl(
            const K &k, int s, int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s != e) {
                const int mid = (s + e) >> 1;
                if (comp(key(mid), k)) {
                    s = mid + 1;
                } else {
                    e = mid;
                }
            }
            return {s};
        }